

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O0

QString * checkExecutable(QString *path)

{
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileInfo info;
  QFileInfo *this;
  QFileInfo local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  this = &local_10;
  QFileInfo::QFileInfo(this,in_RDI);
  bVar1 = QFileInfo::isBundle(this);
  if (bVar1) {
    QFileInfo::bundleName((QFileInfo *)in_RDI);
  }
  else {
    bVar1 = QFileInfo::isFile(this);
    if ((bVar1) && (bVar1 = QFileInfo::isExecutable(this), bVar1)) {
      QDir::cleanPath(in_RDI);
    }
    else {
      QString::QString((QString *)0x2f20fe);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)0x2f2110);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString checkExecutable(const QString &path)
{
    const QFileInfo info(path);
    if (info.isBundle())
        return info.bundleName();
    if (info.isFile() && info.isExecutable())
        return QDir::cleanPath(path);
    return QString();
}